

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::federateQuery_abi_cxx11_
          (CommonCore *this,FederateState *fed,string_view queryStr,bool force_ordering)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  string_view query;
  string_view query_00;
  format_args args;
  bool bVar1;
  GlobalFederateId GVar2;
  char *__a;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  string *psVar3;
  reference other;
  _Map_pointer in_RCX;
  FederateState *in_RDX;
  long in_RSI;
  string *in_RDI;
  _Elt_pointer in_R8;
  byte in_R9B;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_stack_00000138;
  HandleManager *in_stack_00000140;
  GlobalFederateId in_stack_0000014c;
  string_view in_stack_00000150;
  json json;
  string resultString;
  atomic<helics::GlobalFederateId> *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc18;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  size_t in_stack_fffffffffffffc38;
  HandleManager *hm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *in_stack_fffffffffffffc58;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffc68;
  JsonErrorCodes code;
  allocator<char> local_331 [65];
  FederateState *in_stack_fffffffffffffd10;
  CommonCore *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  _Map_pointer local_278;
  _Elt_pointer local_270;
  undefined4 local_268;
  undefined1 in_stack_fffffffffffffdbf;
  undefined4 in_stack_fffffffffffffdc0;
  _Map_pointer ppBVar4;
  _Elt_pointer pBVar5;
  allocator<char> local_1a9 [17];
  _Map_pointer local_198;
  __node_base _Var6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffe78;
  _Prime_rehash_policy in_stack_fffffffffffffe80;
  allocator<char> local_119 [40];
  allocator<char> local_f1 [56];
  allocator<char> local_b9 [40];
  byte local_91;
  FederateState *local_90;
  _Map_pointer local_80;
  _Elt_pointer pBStack_78;
  undefined1 local_68 [24];
  undefined8 local_50;
  undefined1 *local_48;
  char *local_40;
  undefined8 local_38;
  string *local_30;
  char *local_28;
  undefined8 local_20;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_91 = in_R9B & 1;
  if (in_RDX == (FederateState *)0x0) {
    psVar3 = in_RDI;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
               (char *)in_stack_fffffffffffffc18);
    code = (JsonErrorCodes)((ulong)psVar3 >> 0x20);
    __x._M_str = (char *)in_stack_fffffffffffffc40;
    __x._M_len = in_stack_fffffffffffffc38;
    __y._M_str = in_stack_fffffffffffffc30;
    __y._M_len = in_stack_fffffffffffffc28;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48,
                 (allocator<char> *)in_stack_fffffffffffffc40);
      generateJsonErrorResponse(code,in_stack_fffffffffffffc68);
      std::__cxx11::string::~string(in_stack_fffffffffffffc10);
      std::allocator<char>::~allocator(local_f1);
      return in_RDI;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48,
               (allocator<char> *)in_stack_fffffffffffffc40);
    std::allocator<char>::~allocator(local_b9);
    return in_RDI;
  }
  local_90 = in_RDX;
  local_80 = in_RCX;
  pBStack_78 = in_R8;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
             (char *)in_stack_fffffffffffffc18);
  __x_00._M_str = (char *)in_stack_fffffffffffffc40;
  __x_00._M_len = in_stack_fffffffffffffc38;
  __y_00._M_str = in_stack_fffffffffffffc30;
  __y_00._M_len = in_stack_fffffffffffffc28;
  bVar1 = std::operator==(__x_00,__y_00);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48,
               (allocator<char> *)in_stack_fffffffffffffc40);
    std::allocator<char>::~allocator(local_119);
    return in_RDI;
  }
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
             (char *)in_stack_fffffffffffffc18);
  __x_01._M_str = (char *)in_stack_fffffffffffffc40;
  __x_01._M_len = in_stack_fffffffffffffc38;
  __y_01._M_str = in_stack_fffffffffffffc30;
  __y_01._M_len = in_stack_fffffffffffffc28;
  bVar1 = std::operator==(__x_01,__y_01);
  if (bVar1) {
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xfffffffffffffe7f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_stack_fffffffffffffc48,
               (allocator<char> *)in_stack_fffffffffffffc40);
    std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
    std::operator+(in_stack_fffffffffffffc18,(char)((ulong)in_stack_fffffffffffffc10 >> 0x38));
    std::__cxx11::string::~string(in_stack_fffffffffffffc10);
    std::__cxx11::string::~string(in_stack_fffffffffffffc10);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe7f);
    return in_RDI;
  }
  local_198 = local_80;
  _Var6._M_nxt = (_Hash_node_base *)pBStack_78;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
             (char *)in_stack_fffffffffffffc18);
  __x_02._M_str = (char *)in_stack_fffffffffffffc40;
  __x_02._M_len = in_stack_fffffffffffffc38;
  __y_02._M_str = in_stack_fffffffffffffc30;
  __y_02._M_len = in_stack_fffffffffffffc28;
  bVar1 = std::operator==(__x_02,__y_02);
  if (bVar1) {
    bVar1 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_fffffffffffffc18,
                       (memory_order)((ulong)in_stack_fffffffffffffc10 >> 0x20));
    __a = "false";
    if (bVar1) {
      __a = "true";
    }
    __s = local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc50,(char *)__s,(allocator<char> *)__a);
    std::allocator<char>::~allocator(local_1a9);
    return in_RDI;
  }
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
             (char *)in_stack_fffffffffffffc18);
  __x_03._M_str = (char *)in_stack_fffffffffffffc40;
  __x_03._M_len = in_stack_fffffffffffffc38;
  __y_03._M_str = in_stack_fffffffffffffc30;
  __y_03._M_len = in_stack_fffffffffffffc28;
  bVar1 = std::operator==(__x_03,__y_03);
  if ((bVar1) && ((local_91 & 1) == 0)) {
    FederateState::getState((FederateState *)0x471720);
    local_30 = fedStateString_abi_cxx11_((FederateStates)((ulong)in_stack_fffffffffffffc58 >> 0x38))
    ;
    local_28 = "\"{}\"";
    local_20 = 4;
    local_40 = "\"{}\"";
    local_38 = 4;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffc20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc18);
    local_8 = &local_50;
    local_10 = local_68;
    local_50 = 0xd;
    args.field_1.values_ = in_stack_fffffffffffffe78.values_;
    args.desc_ = (unsigned_long_long)_Var6._M_nxt;
    local_48 = local_10;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_fffffffffffffe80,args);
    return in_RDI;
  }
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
             (char *)in_stack_fffffffffffffc18);
  __x_04._M_str = (char *)in_stack_fffffffffffffc40;
  __x_04._M_len = in_stack_fffffffffffffc38;
  __y_04._M_str = in_stack_fffffffffffffc30;
  __y_04._M_len = in_stack_fffffffffffffc28;
  bVar1 = std::operator==(__x_04,__y_04);
  if ((bVar1) && ((local_91 & 1) == 0)) {
    filteredEndpointQuery_abi_cxx11_(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    return in_RDI;
  }
  this_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)(in_RSI + 0x758);
  ppBVar4 = local_80;
  pBVar5 = pBStack_78;
  GVar2 = std::atomic::operator_cast_to_GlobalFederateId(in_stack_fffffffffffffc08);
  hm = (HandleManager *)&stack0xfffffffffffffda0;
  std::
  function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>
  ::
  function<helics::CommonCore::federateQuery(helics::FederateState_const*,std::basic_string_view<char,std::char_traits<char>>,bool)const::__0,void>
            (in_stack_fffffffffffffc20,(anon_class_1_0_00000001 *)in_stack_fffffffffffffc18);
  generateInterfaceQueryResults
            (in_stack_00000150,in_stack_00000140,in_stack_0000014c,in_stack_00000138);
  std::
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  ::~function((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
               *)0x471915);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x471922);
  if (bVar1) {
    local_278 = local_80;
    local_270 = pBStack_78;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
               (char *)in_stack_fffffffffffffc18);
    __x_05._M_str = (char *)in_stack_fffffffffffffc40;
    __x_05._M_len = (size_t)hm;
    __y_05._M_str = (char *)this_00;
    __y_05._M_len = in_stack_fffffffffffffc28;
    bVar1 = std::operator==(__x_05,__y_05);
    if (bVar1) {
      val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x758);
      local_2b0.field_2._M_allocated_capacity._4_4_ =
           std::atomic::operator_cast_to_GlobalFederateId(in_stack_fffffffffffffc08);
      generateInterfaceConfig_abi_cxx11_(hm,(GlobalFederateId *)this_00);
      psVar3 = FederateState::getIdentifier_abi_cxx11_(local_90);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (this_00,val);
      other = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      in_stack_fffffffffffffc10 = &local_2b0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)psVar3,other);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffc10);
      fileops::generateJsonString(other,SUB81((ulong)in_stack_fffffffffffffc10 >> 0x38,0));
      local_268 = 1;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffc10);
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
                 (char *)in_stack_fffffffffffffc18);
      __x_06._M_str = (char *)in_stack_fffffffffffffc40;
      __x_06._M_len = (size_t)hm;
      __y_06._M_str = (char *)this_00;
      __y_06._M_len = in_stack_fffffffffffffc28;
      bVar1 = std::operator==(__x_06,__y_06);
      if (!bVar1) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
                   (char *)in_stack_fffffffffffffc18);
        __x_07._M_str = (char *)in_stack_fffffffffffffc40;
        __x_07._M_len = (size_t)hm;
        __y_07._M_str = (char *)this_00;
        __y_07._M_len = in_stack_fffffffffffffc28;
        bVar1 = std::operator==(__x_07,__y_07);
        if (!bVar1) {
          query_00._M_str = (char *)pBVar5;
          query_00._M_len = (size_t)ppBVar4;
          FederateState::processQuery_abi_cxx11_
                    ((FederateState *)CONCAT44(GVar2.gid,in_stack_fffffffffffffdc0),query_00,
                     (bool)in_stack_fffffffffffffdbf);
          local_268 = 1;
          goto LAB_00471d8a;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48,
                 (allocator<char> *)in_stack_fffffffffffffc40);
      query._M_str = (char *)pBVar5;
      query._M_len = (size_t)ppBVar4;
      FederateState::processQuery_abi_cxx11_
                ((FederateState *)CONCAT44(GVar2.gid,in_stack_fffffffffffffdc0),query,
                 (bool)in_stack_fffffffffffffdbf);
      std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      std::operator+(in_stack_fffffffffffffc18,(char *)in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(in_stack_fffffffffffffc10);
      std::allocator<char>::~allocator(local_331);
      local_268 = 1;
    }
  }
  else {
    std::__cxx11::string::string(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    local_268 = 1;
  }
LAB_00471d8a:
  std::__cxx11::string::~string(in_stack_fffffffffffffc10);
  return in_RDI;
}

Assistant:

std::string CommonCore::federateQuery(const FederateState* fed,
                                      std::string_view queryStr,
                                      bool force_ordering) const
{
    if (fed == nullptr) {
        if (queryStr == "exists") {
            return "false";
        }
        return generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND, "Federate not found");
    }
    if (queryStr == "exists") {
        return "true";
    }
    if (queryStr == "version") {
        return std::string{"\""} + versionString + '"';
    }
    if (queryStr == "isinit") {
        return (fed->init_transmitted.load()) ? "true" : "false";
    }
    if (queryStr == "state") {
        if (!force_ordering) {
            return fmt::format("\"{}\"", fedStateString(fed->getState()));
        }
    }
    if (queryStr == "filtered_endpoints") {
        if (!force_ordering) {
            return filteredEndpointQuery(fed);
        }
    }
    auto resultString = generateInterfaceQueryResults(queryStr,
                                                      loopHandles,
                                                      fed->global_id,
                                                      [](nlohmann::json& /*unused*/) {});
    if (!resultString.empty()) {
        return resultString;
    }
    if (queryStr == "interfaces") {
        auto json = generateInterfaceConfig(loopHandles, fed->global_id);
        json["name"] = fed->getIdentifier();
        return fileops::generateJsonString(json);
    }
    if ((queryStr == "queries") || (queryStr == "available_queries")) {
        return std::string(
                   R"(["exists","isinit","global_state","version","state","queries","interfaces","filtered_endpoints",)") +
            fed->processQuery(queryStr) + "]";
    }
    return fed->processQuery(queryStr, force_ordering);
}